

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_ego_brand(parser *p)

{
  void *pvVar1;
  char *__haystack;
  char *pcVar2;
  void *pvVar3;
  uint local_2c;
  wchar_t i;
  char *s;
  ego_item *e;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  __haystack = parser_getstr(p,"code");
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    local_2c = 1;
    while (((int)local_2c < (int)(uint)z_info->brand_max &&
           (pcVar2 = strstr(__haystack,brands[(int)local_2c].code), pcVar2 == (char *)0x0))) {
      local_2c = local_2c + 1;
    }
    if (local_2c == z_info->brand_max) {
      p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_BRAND;
    }
    else {
      if (*(long *)((long)pvVar1 + 0x1d8) == 0) {
        pvVar3 = mem_zalloc((ulong)z_info->brand_max);
        *(void **)((long)pvVar1 + 0x1d8) = pvVar3;
      }
      *(undefined1 *)(*(long *)((long)pvVar1 + 0x1d8) + (long)(int)local_2c) = 1;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_ego_brand(struct parser *p) {
	struct ego_item *e = parser_priv(p);
	const char *s = parser_getstr(p, "code");
	int i;

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	for (i = 1; i < z_info->brand_max; i++) {
		if (strstr(s, brands[i].code)) break;
	}
	if (i == z_info->brand_max) {
		return PARSE_ERROR_UNRECOGNISED_BRAND;
	}
	if (!e->brands) {
		e->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	}
	e->brands[i] = true;
	return PARSE_ERROR_NONE;
}